

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int __thiscall ghc::filesystem::copy(filesystem *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  int code;
  undefined7 extraout_var;
  filesystem_error *this_00;
  error_code ec_00;
  string local_50;
  undefined1 auStack_30 [8];
  error_code ec;
  copy_options options_local;
  path *to_local;
  path *from_local;
  
  ec._M_cat._6_2_ = SUB82(src,0);
  std::error_code::error_code((error_code *)auStack_30);
  copy((EVP_PKEY_CTX *)this,dst);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_30);
  if (!bVar1) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  this_00 = (filesystem_error *)__cxa_allocate_exception(0x90);
  code = std::error_code::value((error_code *)auStack_30);
  detail::systemErrorText<int>(&local_50,code);
  ec_00._0_8_ = (ulong)auStack_30 & 0xffffffff;
  ec_00._M_cat = (error_category *)ec._0_8_;
  filesystem_error::filesystem_error(this_00,&local_50,(path *)this,(path *)dst,ec_00);
  __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void copy(const path& from, const path& to, copy_options options)
{
    std::error_code ec;
    copy(from, to, options, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), from, to, ec);
    }
}